

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

string * __thiscall JSON::unparse_abi_cxx11_(string *__return_storage_ptr__,JSON *this)

{
  string *__n;
  Pl_String p;
  Pl_String PStack_48;
  
  if ((this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",(allocator<char> *)&PStack_48);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    __n = __return_storage_ptr__;
    Pl_String::Pl_String(&PStack_48,"unparse",(Pipeline *)0x0,__return_storage_ptr__);
    write(this,(int)&PStack_48,(void *)0x0,(size_t)__n);
    Pl_String::~Pl_String(&PStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
JSON::unparse() const
{
    if (!m) {
        return "null";
    }
    std::string s;
    Pl_String p("unparse", nullptr, s);
    write(&p, 0);
    return s;
}